

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  bool bVar1;
  anon_union_8_17_dfc45e9e_for_u p;
  ExprList *pEVar2;
  SrcList *pSVar3;
  Expr *pEVar4;
  With *pWVar5;
  Parse *pPVar6;
  Window *p_00;
  Walker *pWVar7;
  Select *pRet;
  anon_union_8_17_dfc45e9e_for_u *local_78;
  anon_union_8_17_dfc45e9e_for_u local_70;
  anon_union_8_17_dfc45e9e_for_u local_68;
  Walker local_60;
  
  local_68.pNC = (NameContext *)0x0;
  if (pDup != (Select *)0x0) {
    local_78 = &local_68;
    local_70.pNC = (NameContext *)0x0;
    do {
      p.pNC = (NameContext *)sqlite3DbMallocRawNN(db,0x80);
      if ((Select *)p.pNC == (Select *)0x0) {
LAB_0018a875:
        bVar1 = false;
      }
      else {
        pEVar2 = sqlite3ExprListDup(db,pDup->pEList,flags);
        (p.pSelect)->pEList = pEVar2;
        pSVar3 = sqlite3SrcListDup(db,pDup->pSrc,flags);
        (p.pSelect)->pSrc = pSVar3;
        if (pDup->pWhere == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          pEVar4 = exprDup(db,pDup->pWhere,flags,(u8 **)0x0);
        }
        (p.pSelect)->pWhere = pEVar4;
        pEVar2 = sqlite3ExprListDup(db,pDup->pGroupBy,flags);
        (p.pSelect)->pGroupBy = pEVar2;
        if (pDup->pHaving == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          pEVar4 = exprDup(db,pDup->pHaving,flags,(u8 **)0x0);
        }
        (p.pSelect)->pHaving = pEVar4;
        pEVar2 = sqlite3ExprListDup(db,pDup->pOrderBy,flags);
        (p.pSelect)->pOrderBy = pEVar2;
        *p.pCCurHint = (CCurHint)pDup->op;
        (p.pSrcList)->a[0].colUsed = (Bitmask)local_70;
        (p.pSrcList)->a[0].u3.pOn = (Expr *)0x0;
        if (pDup->pLimit == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          pEVar4 = exprDup(db,pDup->pLimit,flags,(u8 **)0x0);
        }
        (p.pSelect)->pLimit = pEVar4;
        (p.pNC)->pSrcList = (SrcList *)0x0;
        (p.pSrcList)->nAlloc = pDup->selFlags & 0xffffffdf;
        ((int *)((long)&(p.pRefSrcList)->nExclude + 4))[0] = -1;
        ((int *)((long)&(p.pRefSrcList)->nExclude + 4))[1] = -1;
        (p.pSelect)->nSelectRow = pDup->nSelectRow;
        pWVar5 = sqlite3WithDup(db,pDup->pWith);
        (p.pSelect)->pWith = pWVar5;
        (p.pSelect)->pWin = (Window *)0x0;
        p_00 = pDup->pWinDefn;
        local_60.pParse = (Parse *)0x0;
        if (p_00 != (Window *)0x0) {
          pWVar7 = &local_60;
          do {
            pPVar6 = (Parse *)sqlite3WindowDup(db,(Expr *)0x0,p_00);
            pWVar7->pParse = pPVar6;
            if (pPVar6 == (Parse *)0x0) break;
            pWVar7 = (Walker *)&pPVar6->iSelfTab;
            p_00 = p_00->pNextWin;
          } while (p_00 != (Window *)0x0);
        }
        (p.pSelect)->pWinDefn = (Window *)local_60.pParse;
        if ((pDup->pWin != (Window *)0x0) && (db->mallocFailed == '\0')) {
          local_60.xExprCallback = gatherSelectWindowsCallback;
          local_60.xSelectCallback = gatherSelectWindowsSelectCallback;
          local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
          local_60.pParse = (Parse *)0x0;
          local_60.u.pNC = p.pNC;
          sqlite3WalkSelect(&local_60,p.pSelect);
        }
        (p.pSelect)->selId = pDup->selId;
        if (db->mallocFailed != '\0') {
          (p.pSrcList)->a[0].colUsed = 0;
          clearSelect(db,p.pSelect,1);
          goto LAB_0018a875;
        }
        local_78->pSelect = (Select *)p;
        local_78 = (anon_union_8_17_dfc45e9e_for_u *)&(p.pSrcList)->a[0].u3;
        bVar1 = true;
        local_70.pNC = p.pNC;
      }
    } while ((bVar1) && (pDup = pDup->pPrior, pDup != (Select *)0x0));
  }
  return (Select *)local_68.pNC;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, const Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  const Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = sqlite3WithDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
    if( p->pWin && db->mallocFailed==0 ) gatherSelectWindows(pNew);
#endif
    pNew->selId = p->selId;
    if( db->mallocFailed ){
      /* Any prior OOM might have left the Select object incomplete.
      ** Delete the whole thing rather than allow an incomplete Select
      ** to be used by the code generator. */
      pNew->pNext = 0;
      sqlite3SelectDelete(db, pNew);
      break;
    }
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}